

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teamcity_messages.cpp
# Opt level: O1

void __thiscall
jetbrains::teamcity::TeamcityMessages::testOutput
          (TeamcityMessages *this,string *name,string *output,string *flowId,bool isStdError)

{
  pointer pcVar1;
  string *value;
  char *name_00;
  undefined3 in_register_00000081;
  RaiiMessage msg;
  RaiiMessage RStack_88;
  long *local_80 [2];
  long local_70 [2];
  string local_60;
  string local_40;
  
  name_00 = "testStdOut";
  if (CONCAT31(in_register_00000081,isStdError) != 0) {
    name_00 = "testStdErr";
  }
  anon_unknown_1::RaiiMessage::RaiiMessage(&RStack_88,name_00,this->m_out);
  pcVar1 = (name->_M_dataplus)._M_p;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,pcVar1,pcVar1 + name->_M_string_length);
  anon_unknown_1::RaiiMessage::writeProperty(&RStack_88,"name",&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  pcVar1 = (output->_M_dataplus)._M_p;
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_60,pcVar1,pcVar1 + output->_M_string_length);
  anon_unknown_1::RaiiMessage::writeProperty(&RStack_88,"out",&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  pcVar1 = (flowId->_M_dataplus)._M_p;
  local_80[0] = local_70;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_80,pcVar1,pcVar1 + flowId->_M_string_length);
  anon_unknown_1::RaiiMessage::writePropertyIfNonEmpty(&RStack_88,(char *)local_80,value);
  if (local_80[0] != local_70) {
    operator_delete(local_80[0],local_70[0] + 1);
  }
  anon_unknown_1::RaiiMessage::~RaiiMessage(&RStack_88);
  return;
}

Assistant:

void TeamcityMessages::testOutput(const std::string& name, const std::string& output, const std::string& flowId, const bool isStdError)
{
    RaiiMessage msg(isStdError ? "testStdErr" : "testStdOut", *m_out);
    msg.writeProperty("name", name);
    msg.writeProperty("out", output);
    msg.writePropertyIfNonEmpty("flowId", flowId);
}